

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LU.hpp
# Opt level: O2

bool OpenMD::invertMatrix<OpenMD::DynamicRectMatrix<double>>
               (DynamicRectMatrix<double> *A,DynamicRectMatrix<double> *AI,uint size,int *tmp1Size,
               ElemPoinerType tmp2Size)

{
  uint uVar1;
  double **ppdVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar1 = A->nrow_;
  bVar3 = false;
  if ((((uVar1 == size) && (bVar3 = false, uVar1 == A->ncol_)) &&
      (bVar3 = false, uVar1 == AI->nrow_)) && (A->ncol_ == AI->ncol_)) {
    iVar4 = LUFactorLinearSystem<OpenMD::DynamicRectMatrix<double>>(A,tmp1Size,size,tmp2Size);
    if (iVar4 == 0) {
      bVar3 = false;
    }
    else {
      uVar6 = (ulong)size;
      for (uVar7 = 0; uVar7 != uVar6; uVar7 = uVar7 + 1) {
        for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
          tmp2Size[uVar5] = 0.0;
        }
        tmp2Size[uVar7] = 1.0;
        LUSolveLinearSystem<OpenMD::DynamicRectMatrix<double>>(A,tmp1Size,tmp2Size,size);
        ppdVar2 = AI->data_;
        for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
          ppdVar2[uVar5][uVar7] = tmp2Size[uVar5];
        }
      }
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

bool invertMatrix(MatrixType& A, MatrixType& AI, unsigned int size,
                    int* tmp1Size,
                    typename MatrixType::ElemPoinerType tmp2Size) {
    if (A.getNRow() != A.getNCol() || A.getNRow() != AI.getNRow() ||
        A.getNCol() != AI.getNCol() || A.getNRow() != size) {
      return false;
    }

    unsigned int i, j;

    //
    // Factor matrix; then begin solving for inverse one column at a time.
    // Note: tmp1Size returned value is used later, tmp2Size is just working
    // memory whose values are not used in LUSolveLinearSystem
    //
    if (LUFactorLinearSystem(A, tmp1Size, size, tmp2Size) == 0) {
      return false;
    }

    for (j = 0; j < size; ++j) {
      for (i = 0; i < size; ++i) {
        tmp2Size[i] = 0.0;
      }
      tmp2Size[j] = 1.0;

      LUSolveLinearSystem(A, tmp1Size, tmp2Size, size);

      for (i = 0; i < size; i++) {
        AI(i, j) = tmp2Size[i];
      }
    }

    return true;
  }